

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_schema_nodeid
              (char *nodeid,lys_node *start_parent,lys_module *cur_module,ly_set **ret,int extended,
              int no_node_error)

{
  char cVar1;
  bool bVar2;
  ly_set **pplVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  lys_node *plVar8;
  lys_module *plVar9;
  lys_node *plVar10;
  lys_node *plVar11;
  ly_set *plVar12;
  char *pcVar13;
  lys_node *last;
  ulong uVar14;
  LY_ECODE ecode;
  lys_node *plVar15;
  char *pcVar16;
  ly_ctx *plVar17;
  undefined4 in_register_00000084;
  ulong uVar18;
  undefined8 uVar19;
  int *all_desc_00;
  char *yang_data_name;
  char *local_f0;
  int local_e8;
  int local_e4;
  int nam_len_1;
  char *model;
  char *local_d0;
  lys_module *local_c8;
  int local_bc;
  int local_b8;
  int mod_len;
  int has_predicate_1;
  int all_desc;
  char *name;
  lys_module *local_a0;
  char *local_98;
  lys_module *local_90;
  ly_set **local_88;
  ulong local_80;
  int local_74;
  lys_node *plStack_70;
  int has_predicate;
  char *local_68;
  char *mod_name;
  lys_node *plStack_58;
  int nam_len;
  int local_4c;
  lys_node *plStack_48;
  int is_relative;
  ly_ctx *local_40;
  int local_34 [2];
  int mod_name_len;
  
  name = (char *)CONCAT44(in_register_00000084,extended);
  local_34[0] = 0;
  local_4c = -1;
  local_e4 = no_node_error;
  if (((nodeid == (char *)0x0) ||
      (start_parent == (lys_node *)0x0 && cur_module == (lys_module *)0x0)) ||
     (ret == (ly_set **)0x0)) {
    __assert_fail("nodeid && (start_parent || cur_module) && ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x766,
                  "int resolve_schema_nodeid(const char *, const struct lys_node *, const struct lys_module *, struct ly_set **, int, int)"
                 );
  }
  *ret = (ly_set *)0x0;
  if (cur_module == (lys_module *)0x0) {
    cur_module = lys_node_module(start_parent);
  }
  plVar17 = cur_module->ctx;
  uVar4 = parse_schema_nodeid(nodeid,&local_68,local_34,(char **)&has_predicate_1,
                              (int *)((long)&mod_name + 4),&local_4c,(int *)0x0,(int *)0x0,1);
  if ((int)uVar4 < 1) {
    _has_predicate_1 = nodeid + -uVar4;
    uVar18 = (ulong)(uint)(int)nodeid[-uVar4];
  }
  else {
    local_90 = cur_module;
    local_88 = ret;
    plStack_58 = start_parent;
    if (*_has_predicate_1 == '#') {
      if (local_4c != 0) {
        uVar18 = 0x23;
        goto LAB_00113957;
      }
      yang_data_name = _has_predicate_1 + 1;
      model = (char *)CONCAT44(model._4_4_,mod_name._4_4_ + -1);
      pcVar13 = local_68;
      pcVar16 = nodeid + uVar4;
      iVar6 = local_34[0];
    }
    else {
      local_4c = -1;
      pcVar13 = (char *)0x0;
      yang_data_name = (char *)0x0;
      iVar6 = 0;
      pcVar16 = nodeid;
    }
    all_desc_00 = &mod_len;
    if ((int)name == 0) {
      all_desc_00 = (int *)0x0;
    }
    local_d0 = nodeid;
    local_40 = plVar17;
    uVar4 = parse_schema_nodeid(pcVar16,&local_68,local_34,(char **)&has_predicate_1,
                                (int *)((long)&mod_name + 4),&local_4c,&local_74,all_desc_00,
                                (int)name);
    uVar18 = (ulong)uVar4;
    if (0 < (int)uVar4) {
      if (pcVar13 != (char *)0x0) {
        local_68 = pcVar13;
        local_34[0] = iVar6;
      }
      if (local_4c != 0 && plStack_58 == (lys_node *)0x0) {
        ly_vlog(local_40,LYE_SPEC,LY_VLOG_STR,local_d0,
                "Starting node must be provided for relative paths.");
        return -1;
      }
      if (local_4c == 0) {
        local_a0 = lyp_get_module(local_90,(char *)0x0,0,local_68,local_34[0],0);
        if (local_a0 == (lys_module *)0x0) {
LAB_00113a1c:
          pcVar16 = strndup(local_68,(long)local_34[0]);
          ecode = LYE_PATH_INMOD;
LAB_00113a35:
          ly_vlog(local_40,ecode,LY_VLOG_STR,pcVar16);
          free(pcVar16);
          return -1;
        }
        if (yang_data_name == (char *)0x0) {
          plStack_58 = (lys_node *)0x0;
        }
        else {
          iVar6 = (int)model;
          plStack_58 = lyp_get_yang_data_template(local_a0,yang_data_name,(int)model);
          if (plStack_58 == (lys_node *)0x0) {
            _has_predicate_1 = yang_data_name + ((long)iVar6 - (long)local_d0);
LAB_001139de:
            pcVar16 = strndup(local_d0,(size_t)_has_predicate_1);
            ecode = LYE_PATH_INNODE;
            goto LAB_00113a35;
          }
        }
      }
      else {
        local_a0 = lys_node_module(plStack_58);
        local_90 = local_a0;
      }
      local_98 = pcVar16 + uVar18;
      local_80 = 0;
      local_c8 = (lys_module *)0x0;
      plVar15 = plStack_58;
LAB_001132e3:
      iVar6 = local_34[0];
      pcVar16 = local_68;
      plVar9 = local_90;
      if (plVar15 == (lys_node *)0x0) {
        plVar15 = (lys_node *)0x0;
        last = (lys_node *)0x0;
        goto LAB_0011337f;
      }
      local_c8 = local_90;
      plStack_58 = plVar15;
      if (local_68 != (char *)0x0) {
        pcVar13 = local_90->name;
        iVar5 = strncmp(local_68,pcVar13,(long)local_34[0]);
        if (iVar5 == 0) {
          sVar7 = strlen(pcVar13);
          local_c8 = plVar9;
          if (iVar6 == (int)sVar7) goto LAB_00113363;
        }
        local_c8 = lyp_get_module(plVar9,(char *)0x0,0,pcVar16,iVar6,0);
        if (local_c8 == (lys_module *)0x0) goto LAB_00113a1c;
      }
LAB_00113363:
      last = (lys_node *)0x0;
      plVar15 = plStack_58;
      if ((int)name != 0) goto LAB_0011337f;
      do {
        last = (lys_node *)lys_getnext_target_aug((lys_node_augment *)last,local_c8,plVar15);
LAB_0011337f:
        plVar10 = last;
        if (last == (lys_node *)0x0) {
          plVar10 = plVar15;
        }
        plVar8 = lys_getnext((lys_node *)0x0,plVar10,local_a0,0x18b);
        bVar2 = true;
        plVar11 = plVar8;
        if (plVar8 != (lys_node *)0x0) {
          do {
            while( true ) {
              plStack_48 = plVar11;
              plStack_58 = plVar15;
              plStack_70 = plVar10;
              uVar4 = schema_nodeid_siblingcheck
                                (plVar8,local_90,local_68,local_34[0],_has_predicate_1,
                                 mod_name._4_4_);
              pplVar3 = local_88;
              uVar18 = (ulong)uVar4;
              plVar15 = plStack_48;
              if ((((int)name == 0) || (plVar15 = plVar8, uVar4 != 3 && (uVar4 & 0xfffffffd) != 0))
                 || (local_74 == 0)) break;
              pcVar16 = local_98;
              if ((plVar8->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
LAB_00113423:
                uVar4 = parse_schema_json_predicate
                                  (pcVar16,(char **)&nam_len_1,&local_bc,&local_f0,&local_e8,
                                   (char **)0x0,(int *)0x0,&local_b8);
                if ((int)uVar4 < 1) {
                  plVar17 = local_90->ctx;
                  _has_predicate_1 = pcVar16 + (int)uVar4;
                  uVar18 = (ulong)(uint)(int)pcVar16[(int)uVar4];
                  goto LAB_00113957;
                }
                if (plVar8->nodetype == LYS_LEAFLIST) {
                  if (((local_f0 != (char *)0x0 && _nam_len_1 == (char *)0x0) && (*local_f0 == '.'))
                     && (pcVar16 = pcVar16 + uVar4, local_b8 == 0)) goto LAB_0011378c;
                }
                else if (plVar8->padding[2] != '\0') {
                  uVar18 = 0;
                  model = pcVar16 + uVar4;
                  do {
                    plVar15 = *(lys_node **)(*(long *)&plVar8[1].flags + uVar18 * 8);
                    pcVar16 = plVar15->name;
                    sVar7 = (size_t)local_e8;
                    iVar6 = strncmp(pcVar16,local_f0,sVar7);
                    pcVar13 = _nam_len_1;
                    if ((iVar6 == 0) && (pcVar16[sVar7] == '\0')) {
                      plVar9 = lys_node_module(plVar15);
                      if (pcVar13 == (char *)0x0) {
                        if (plVar9 == local_90) break;
                      }
                      else {
                        iVar6 = strncmp(plVar9->name,_nam_len_1,(long)local_bc);
                        if ((iVar6 == 0) &&
                           (plVar9 = lys_node_module(*(lys_node **)
                                                      (*(long *)&plVar8[1].flags + uVar18 * 8)),
                           plVar9->name[local_bc] == '\0')) break;
                      }
                    }
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < plVar8->padding[2]);
                  if ((uint)uVar18 != (uint)plVar8->padding[2]) goto code_r0x00113532;
                }
              }
              plVar8 = lys_getnext(plVar8,plStack_70,local_a0,0x18b);
              plVar10 = plStack_70;
              plVar15 = plStack_58;
              plVar11 = plStack_48;
              if (plVar8 == (lys_node *)0x0) {
                uVar18 = 1;
                goto LAB_0011380a;
              }
            }
            plStack_48 = plVar15;
            local_80 = local_80 & 0xffffffff;
            if (*local_98 == '\0') {
              local_80 = 1;
            }
            plVar15 = plStack_70;
            switch(uVar4) {
            case 0:
              plVar8 = plStack_48;
LAB_0011379a:
              if ((int)local_80 == 0) {
                bVar2 = false;
                local_80 = 0;
                uVar18 = 0;
                plVar15 = plVar8;
                if ((plVar8->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
                  return -1;
                }
              }
              else {
                uVar14 = local_80 & 0xffffffff;
LAB_001137a4:
                plVar17 = local_40;
                plVar12 = ly_set_new();
                *local_88 = plVar12;
                if (plVar12 == (ly_set *)0x0) {
LAB_00113a95:
                  ly_log(plVar17,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                         "resolve_schema_nodeid");
                  return -1;
                }
                local_40 = plVar17;
                ly_set_add(plVar12,plVar8,1);
                bVar2 = false;
                uVar18 = 0;
                plVar15 = plStack_58;
                local_80 = uVar14;
              }
              goto LAB_00113810;
            case 1:
              break;
            case 2:
              plVar12 = *local_88;
              if (plVar12 == (ly_set *)0x0) {
                plVar12 = ly_set_new();
                *pplVar3 = plVar12;
                plVar17 = local_40;
                if (plVar12 == (ly_set *)0x0) goto LAB_00113a95;
              }
              ly_set_add(plVar12,plStack_48,1);
              plVar10 = plStack_48;
              plVar15 = plStack_70;
              if (mod_len != 0) {
                while( true ) {
                  do {
                    plVar8 = plVar10;
                    if (plVar8 != plStack_48) {
                      ly_set_add(*local_88,plVar8,1);
                      plVar15 = plStack_70;
                    }
                  } while (((plVar8->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)
                          && (plVar10 = plVar8->child, plVar8->child != (lys_node *)0x0));
                  if (plVar8 == plStack_48) break;
                  while (plVar10 = plVar8->next, plVar8->next == (lys_node *)0x0) {
                    plVar8 = plVar8->parent;
                    if (plVar8->nodetype == LYS_AUGMENT) {
                      plVar8 = plVar8->prev;
                    }
                    plVar10 = lys_parent(plVar8);
                    plVar11 = lys_parent(plStack_48);
                    plVar15 = plStack_70;
                    if (plVar10 == plVar11) goto switchD_001135db_caseD_1;
                  }
                }
              }
              break;
            case 3:
              plVar12 = *local_88;
              if (plVar12 == (ly_set *)0x0) {
                plVar12 = ly_set_new();
                *pplVar3 = plVar12;
                plVar17 = local_40;
                if (plVar12 == (ly_set *)0x0) goto LAB_00113a95;
                if (plStack_58 != (lys_node *)0x0) {
                  ly_set_add(plVar12,plStack_58,1);
                  plVar12 = *pplVar3;
                }
              }
              ly_set_add(plVar12,plStack_48,1);
              plVar10 = plStack_48;
              plVar15 = plStack_70;
              if (mod_len != 0) {
                while( true ) {
                  do {
                    plVar8 = plVar10;
                    if (plVar8 != plStack_48) {
                      ly_set_add(*local_88,plVar8,1);
                      plVar15 = plStack_70;
                    }
                  } while (((plVar8->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN)
                          && (plVar10 = plVar8->child, plVar8->child != (lys_node *)0x0));
                  if (plVar8 == plStack_48) break;
                  while (plVar10 = plVar8->next, plVar8->next == (lys_node *)0x0) {
                    plVar8 = plVar8->parent;
                    if (plVar8->nodetype == LYS_AUGMENT) {
                      plVar8 = plVar8->prev;
                    }
                    plVar10 = lys_parent(plVar8);
                    plVar11 = lys_parent(plStack_48);
                    plVar15 = plStack_70;
                    if (plVar10 == plVar11) goto switchD_001135db_caseD_1;
                  }
                }
              }
              break;
            default:
              uVar19 = 0x80e;
              goto LAB_00113a10;
            }
switchD_001135db_caseD_1:
            plVar8 = lys_getnext(plStack_48,plVar15,local_a0,0x18b);
            plVar10 = plStack_70;
            plVar15 = plStack_58;
            plVar11 = plVar8;
          } while (plVar8 != (lys_node *)0x0);
LAB_0011380a:
          bVar2 = true;
          plVar15 = plStack_58;
        }
LAB_00113810:
        pcVar16 = local_98;
        if (((int)name != 0) && (local_74 != 0)) {
          cVar1 = *local_98;
          while (cVar1 == '[') {
            pcVar13 = strchr(pcVar16,0x5d);
            if (pcVar13 == (char *)0x0) {
              uVar19 = 0x818;
LAB_00113a10:
              ly_log(local_40,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                     ,uVar19);
              return -1;
            }
            pcVar16 = pcVar13 + 1;
            cVar1 = pcVar13[1];
          }
        }
        if ((((int)local_80 != 0) && ((uint)uVar18 < 4)) && ((uint)uVar18 != 1)) {
          return 0;
        }
        if (!bVar2) goto LAB_001138a6;
        local_98 = pcVar16;
        if (last == (lys_node *)0x0) {
          if (local_e4 == 0) {
            *local_88 = (ly_set *)0x0;
            return 0;
          }
          _has_predicate_1 = _has_predicate_1 + ((long)mod_name._4_4_ - (long)local_d0);
          goto LAB_001139de;
        }
      } while( true );
    }
LAB_001138fd:
    _has_predicate_1 = pcVar16 + -uVar4;
    uVar18 = (ulong)(uint)(int)pcVar16[-uVar4];
    plVar17 = local_40;
  }
LAB_00113957:
  ly_vlog(plVar17,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar18,_has_predicate_1);
  return -1;
code_r0x00113532:
  pcVar16 = model;
  if (local_b8 == 0) {
LAB_0011378c:
    uVar14 = 1;
    if (*pcVar16 != '\0') goto LAB_0011379a;
    goto LAB_001137a4;
  }
  goto LAB_00113423;
LAB_001138a6:
  uVar4 = parse_schema_nodeid(pcVar16,&local_68,local_34,(char **)&has_predicate_1,
                              (int *)((long)&mod_name + 4),&local_4c,&local_74,all_desc_00,(int)name
                             );
  uVar18 = (ulong)uVar4;
  if ((int)uVar4 < 1) goto LAB_001138fd;
  local_98 = pcVar16 + uVar18;
  goto LAB_001132e3;
}

Assistant:

int
resolve_schema_nodeid(const char *nodeid, const struct lys_node *start_parent, const struct lys_module *cur_module,
                      struct ly_set **ret, int extended, int no_node_error)
{
    const char *name, *mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    const struct lys_node *sibling, *next, *elem;
    struct lys_node_augment *last_aug;
    int r, nam_len, mod_name_len = 0, is_relative = -1, all_desc, has_predicate, nodeid_end = 0;
    int yang_data_name_len, backup_mod_name_len = 0;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *start_mod, *aux_mod = NULL;
    char *str;
    struct ly_ctx *ctx;

    assert(nodeid && (start_parent || cur_module) && ret);
    *ret = NULL;

    if (!cur_module) {
        cur_module = lys_node_module(start_parent);
    }
    ctx = cur_module->ctx;
    id = nodeid;

    r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1);
    if (r < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return -1;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return -1;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        id += r;
    } else {
        is_relative = -1;
    }

    r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate,
                            (extended ? &all_desc : NULL), extended);
    if (r < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return -1;
    }
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    if (is_relative && !start_parent) {
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_STR, nodeid, "Starting node must be provided for relative paths.");
        return -1;
    }

    /* descendant-schema-nodeid */
    if (is_relative) {
        cur_module = start_mod = lys_node_module(start_parent);

    /* absolute-schema-nodeid */
    } else {
        start_mod = lyp_get_module(cur_module, NULL, 0, mod_name, mod_name_len, 0);
        if (!start_mod) {
            str = strndup(mod_name, mod_name_len);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return -1;
        }
        start_parent = NULL;
        if (yang_data_name) {
            start_parent = lyp_get_yang_data_template(start_mod, yang_data_name, yang_data_name_len);
            if (!start_parent) {
                str = strndup(nodeid, (yang_data_name + yang_data_name_len) - nodeid);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return -1;
            }
        }
    }

    while (1) {
        sibling = NULL;
        last_aug = NULL;

        if (start_parent) {
            if (mod_name && (strncmp(mod_name, cur_module->name, mod_name_len)
                    || (mod_name_len != (signed)strlen(cur_module->name)))) {
                /* we are getting into another module (augment) */
                aux_mod = lyp_get_module(cur_module, NULL, 0, mod_name, mod_name_len, 0);
                if (!aux_mod) {
                    str = strndup(mod_name, mod_name_len);
                    LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                    free(str);
                    return -1;
                }
            } else {
                /* there is no mod_name, so why are we checking augments again?
                 * because this module may be not implemented and it augments something in another module and
                 * there is another augment augmenting that previous one */
                aux_mod = cur_module;
            }

            /* look into augments */
            if (!extended) {
get_next_augment:
                last_aug = lys_getnext_target_aug(last_aug, aux_mod, start_parent);
            }
        }

        while ((sibling = lys_getnext(sibling, (last_aug ? (struct lys_node *)last_aug : start_parent), start_mod,
                LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT | LYS_GETNEXT_PARENTUSES | LYS_GETNEXT_NOSTATECHECK))) {
            r = schema_nodeid_siblingcheck(sibling, cur_module, mod_name, mod_name_len, name, nam_len);

            /* resolve predicate */
            if (extended && ((r == 0) || (r == 2) || (r == 3)) && has_predicate) {
                r = resolve_extended_schema_nodeid_predicate(id, sibling, cur_module, &nodeid_end);
                if (r == 1) {
                    continue;
                } else if (r == -1) {
                    return -1;
                }
            } else if (!id[0]) {
                nodeid_end = 1;
            }

            if (r == 0) {
                /* one matching result */
                if (nodeid_end) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                    ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                } else {
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        return -1;
                    }
                    start_parent = sibling;
                }
                break;
            } else if (r == 1) {
                continue;
            } else if (r == 2) {
                /* "*" */
                if (!*ret) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                }
                ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                if (all_desc) {
                    LY_TREE_DFS_BEGIN(sibling, next, elem) {
                        if (elem != sibling) {
                            ly_set_add(*ret, (void *)elem, LY_SET_OPT_USEASLIST);
                        }

                        LY_TREE_DFS_END(sibling, next, elem);
                    }
                }
            } else if (r == 3) {
                /* "." */
                if (!*ret) {
                    *ret = ly_set_new();
                    LY_CHECK_ERR_RETURN(!*ret, LOGMEM(ctx), -1);
                    if (start_parent) {
                        ly_set_add(*ret, (void *)start_parent, LY_SET_OPT_USEASLIST);
                    }
                }
                ly_set_add(*ret, (void *)sibling, LY_SET_OPT_USEASLIST);
                if (all_desc) {
                    LY_TREE_DFS_BEGIN(sibling, next, elem) {
                        if (elem != sibling) {
                            ly_set_add(*ret, (void *)elem, LY_SET_OPT_USEASLIST);
                        }

                        LY_TREE_DFS_END(sibling, next, elem);
                    }
                }
            } else {
                LOGINT(ctx);
                return -1;
            }
        }

        /* skip predicate */
        if (extended && has_predicate) {
            while (id[0] == '[') {
                id = strchr(id, ']');
                if (!id) {
                    LOGINT(ctx);
                    return -1;
                }
                ++id;
            }
        }

        if (nodeid_end && ((r == 0) || (r == 2) || (r == 3))) {
            return EXIT_SUCCESS;
        }

        /* no match */
        if (!sibling) {
            if (last_aug) {
                /* it still could be in another augment */
                goto get_next_augment;
            }
            if (no_node_error) {
                str = strndup(nodeid, (name - nodeid) + nam_len);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return -1;
            }
            *ret = NULL;
            return EXIT_SUCCESS;
        }

        r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate,
                                (extended ? &all_desc : NULL), extended);
        if (r < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return -1;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(ctx);
    return -1;
}